

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O0

BrotliDecoderErrorCode
duckdb_brotli::ReadSimpleHuffmanSymbols
          (uint64_t alphabet_size_max,uint64_t alphabet_size_limit,BrotliDecoderStateInternal *s)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  BrotliBitReader *pBVar5;
  uint64_t result;
  ulong local_100;
  ulong local_f8;
  ulong local_e8;
  uint64_t k;
  uint64_t v;
  uint64_t num_symbols;
  uint64_t i;
  uint64_t max_bits;
  BrotliMetablockHeaderArena *h;
  BrotliBitReader *br;
  BrotliDecoderStateInternal *s_local;
  uint64_t alphabet_size_limit_local;
  uint64_t alphabet_size_max_local;
  ulong local_10;
  ulong local_8;
  
  pBVar5 = &s->br;
  local_10 = 0;
  for (local_8 = alphabet_size_max - 1; local_8 != 0; local_8 = local_8 >> 1) {
    local_10 = local_10 + 1;
  }
  local_e8 = (s->arena).header.sub_loop_counter;
  uVar1 = (s->arena).header.symbol;
  do {
    if (uVar1 < local_e8) {
      local_e8 = 0;
      do {
        uVar3 = local_e8;
        if (uVar1 <= local_e8) {
          return BROTLI_DECODER_SUCCESS;
        }
        while (local_100 = uVar3 + 1, local_100 <= uVar1) {
          lVar4 = uVar3 * 2;
          uVar3 = local_100;
          if (*(short *)((long)&s->arena + local_e8 * 2 + 200) ==
              *(short *)((long)&s->arena + lVar4 + 0xca)) {
            return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
          }
        }
        local_e8 = local_e8 + 1;
      } while( true );
    }
    while ((s->br).bit_pos_ < local_10) {
      if ((s->br).next_in == (s->br).last_in) {
        bVar2 = false;
        goto LAB_023ec133;
      }
      pBVar5->val_ = pBVar5->val_ | (ulong)*(s->br).next_in << ((byte)(s->br).bit_pos_ & 0x3f);
      (s->br).bit_pos_ = (s->br).bit_pos_ + 8;
      (s->br).next_in = (s->br).next_in + 1;
    }
    local_f8 = pBVar5->val_ & *(ulong *)(kBrotliBitMask + local_10 * 8);
    (s->br).bit_pos_ = (s->br).bit_pos_ - local_10;
    pBVar5->val_ = pBVar5->val_ >> ((byte)local_10 & 0x3f);
    bVar2 = true;
LAB_023ec133:
    if (!bVar2) {
      (s->arena).header.sub_loop_counter = local_e8;
      (s->arena).header.substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if (alphabet_size_limit <= local_f8) {
      return BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET;
    }
    *(short *)((long)&s->arena + local_e8 * 2 + 200) = (short)local_f8;
    local_e8 = local_e8 + 1;
  } while( true );
}

Assistant:

static BrotliDecoderErrorCode ReadSimpleHuffmanSymbols(brotli_reg_t alphabet_size_max, brotli_reg_t alphabet_size_limit,
                                                       BrotliDecoderState *s) {
	/* max_bits == 1..11; symbol == 0..3; 1..44 bits will be read. */
	BrotliBitReader *br = &s->br;
	BrotliMetablockHeaderArena *h = &s->arena.header;
	brotli_reg_t max_bits = Log2Floor(alphabet_size_max - 1);
	brotli_reg_t i = h->sub_loop_counter;
	brotli_reg_t num_symbols = h->symbol;
	while (i <= num_symbols) {
		brotli_reg_t v;
		if (BROTLI_PREDICT_FALSE(!BrotliSafeReadBits(br, max_bits, &v))) {
			h->sub_loop_counter = i;
			h->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
			return BROTLI_DECODER_NEEDS_MORE_INPUT;
		}
		if (v >= alphabet_size_limit) {
			return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET);
		}
		h->symbols_lists_array[i] = (uint16_t)v;
		BROTLI_LOG_UINT(h->symbols_lists_array[i]);
		++i;
	}

	for (i = 0; i < num_symbols; ++i) {
		brotli_reg_t k = i + 1;
		for (; k <= num_symbols; ++k) {
			if (h->symbols_lists_array[i] == h->symbols_lists_array[k]) {
				return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME);
			}
		}
	}

	return BROTLI_DECODER_SUCCESS;
}